

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O3

void Vec_IntIsOrdered(Vec_Int_t *vCut)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  uVar1 = vCut->nSize;
  if ((int)uVar1 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (uVar1 != 1) {
    uVar3 = 1;
    iVar4 = *vCut->pArray;
    do {
      iVar2 = vCut->pArray[uVar3];
      if (iVar2 <= iVar4) {
        __assert_fail("Prev < Entry",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                      ,0xca,"void Vec_IntIsOrdered(Vec_Int_t *)");
      }
      uVar3 = uVar3 + 1;
      iVar4 = iVar2;
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

void Vec_IntIsOrdered( Vec_Int_t * vCut )
{
    int i, Prev, Entry;
    Prev = Vec_IntEntry( vCut, 0 );
    Vec_IntForEachEntryStart( vCut, Entry, i, 1 )
    {
        assert( Prev < Entry );
        Prev = Entry;
    }
}